

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::default_unit(string *unit_type)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  pointer pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  precise_unit pVar8;
  precise_unit tunit;
  size_type fof;
  const_iterator fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  __const_iterator in_stack_fffffffffffffb40;
  precise_unit *this;
  __const_iterator in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  undefined1 local_348 [32];
  precise_unit local_328;
  precise_unit local_311 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0 [2];
  allocator<char> local_2a9 [72];
  allocator<char> local_261 [72];
  allocator<char> local_219 [72];
  allocator<char> local_1d1 [40];
  allocator<char> local_1a9 [40];
  allocator<char> local_181 [65];
  precise_unit local_140;
  size_type local_f0;
  precise_unit local_c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_98;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_90;
  char *local_88;
  char *local_80;
  undefined1 local_69;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  string *in_stack_ffffffffffffffe0;
  precise_unit local_10;
  
  if ((default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_)
     , iVar4 != 0)) {
    loadDefinedMeasurementTypes_abi_cxx11_();
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 ::~unordered_map,&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  }
  sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if (sVar5 == 1) {
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffb10,(size_type)in_stack_fffffffffffffb08);
    cVar1 = *pvVar6;
    if (cVar1 == -0x38) {
      local_10.base_units_ = (unit_data)0x10000;
      local_10.commodity_ = 0;
      local_10.multiplier_ = 1.0;
      return local_10;
    }
    if (cVar1 == 'I') {
      local_10.base_units_ = (unit_data)0x800;
      local_10.commodity_ = 0;
      local_10.multiplier_ = 1.0;
      return local_10;
    }
    if (cVar1 == 'J') {
      local_10.base_units_ = (unit_data)0x4000;
      local_10.commodity_ = 0;
      local_10.multiplier_ = 1.0;
      return local_10;
    }
    if (cVar1 == 'L') {
      local_10.base_units_ = (unit_data)0x1;
      local_10.commodity_ = 0;
      local_10.multiplier_ = 1.0;
      return local_10;
    }
    if (cVar1 == 'M') {
      local_10.base_units_ = (unit_data)0x100;
      local_10.commodity_ = 0;
      local_10.multiplier_ = 1.0;
      return local_10;
    }
    if (cVar1 == 'N') {
      local_10.base_units_ = (unit_data)0x80000;
      local_10.commodity_ = 0;
      local_10.multiplier_ = 1.0;
      return local_10;
    }
    if (cVar1 == 'T') {
      local_10.base_units_ = (unit_data)0x10;
      local_10.commodity_ = 0;
      local_10.multiplier_ = 1.0;
      return local_10;
    }
  }
  local_30 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                               (in_stack_fffffffffffffb08);
  local_38 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                               (in_stack_fffffffffffffb18._M_current);
  local_40 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                               (in_stack_fffffffffffffb08);
  local_48 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                               (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                                in_stack_fffffffffffffb18,(_func_int_int *)in_stack_fffffffffffffb10
                               );
  local_60 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                               (in_stack_fffffffffffffb08);
  local_68 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                               (in_stack_fffffffffffffb18._M_current);
  local_69 = 0x20;
  local_58 = (char *)std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                               (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                                in_stack_fffffffffffffb18._M_current);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb10,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb08);
  local_80 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                               (in_stack_fffffffffffffb18._M_current);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb10,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffb08);
  local_88 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                                in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  local_90._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
               *)in_stack_fffffffffffffb08,(key_type *)0x6b948b);
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
              *)in_stack_fffffffffffffb08);
  bVar2 = std::__detail::operator==(&local_90,&local_98);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffb40._M_current,
                    CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                    (size_type)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28._M_current);
    if (iVar4 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb28._M_current,
                 (size_type)in_stack_fffffffffffffb20._M_current,
                 (size_type)in_stack_fffffffffffffb18._M_current);
      local_10 = default_unit(in_stack_ffffffffffffffe0);
      std::__cxx11::string::~string(in_stack_fffffffffffffb10);
    }
    else {
      iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffb40._M_current,
                      CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                      (size_type)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28._M_current);
      if (iVar4 == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28._M_current,
                   (size_type)in_stack_fffffffffffffb20._M_current,
                   (size_type)in_stack_fffffffffffffb18._M_current);
        local_c8 = default_unit(in_stack_ffffffffffffffe0);
        local_10 = precise_unit::operator/
                             ((precise_unit *)in_stack_fffffffffffffb40._M_current,
                              (precise_unit *)
                              CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
        std::__cxx11::string::~string(in_stack_fffffffffffffb10);
      }
      else {
        local_f0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb30,in_stack_fffffffffffffb28._M_current,
                         (size_type)in_stack_fffffffffffffb20._M_current);
        if (local_f0 == 0xffffffffffffffff) {
          local_f0 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28._M_current,
                                   (size_type)in_stack_fffffffffffffb20._M_current);
          if (local_f0 == 0xffffffffffffffff) {
            iVar4 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb40._M_current,
                               CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                               (size_type)in_stack_fffffffffffffb30,
                               in_stack_fffffffffffffb28._M_current);
            if (iVar4 == 0) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb28._M_current,
                     (size_type)in_stack_fffffffffffffb20._M_current,
                     (size_type)in_stack_fffffffffffffb18._M_current);
              local_140 = default_unit(in_stack_ffffffffffffffe0);
              std::__cxx11::string::~string(in_stack_fffffffffffffb10);
              bVar2 = is_error((precise_unit *)in_stack_fffffffffffffb20._M_current);
              if (!bVar2) {
                pVar8 = precise_unit::inv((precise_unit *)in_stack_fffffffffffffb20._M_current);
                return pVar8;
              }
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48._M_current,
                       (allocator<char> *)in_stack_fffffffffffffb40._M_current);
            bVar2 = ends_with((string *)in_stack_fffffffffffffb20._M_current,
                              (string *)in_stack_fffffffffffffb18._M_current);
            std::__cxx11::string::~string(in_stack_fffffffffffffb10);
            std::allocator<char>::~allocator(local_181);
            if (bVar2) {
              local_10 = (precise_unit)ZEXT816(0x3ff0000000000000);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48._M_current,
                         (allocator<char> *)in_stack_fffffffffffffb40._M_current);
              bVar2 = ends_with((string *)in_stack_fffffffffffffb20._M_current,
                                (string *)in_stack_fffffffffffffb18._M_current);
              std::__cxx11::string::~string(in_stack_fffffffffffffb10);
              std::allocator<char>::~allocator(local_1a9);
              if (bVar2) {
                local_10 = (precise_unit)ZEXT816(0x3ff0000000000000);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48._M_current,
                           (allocator<char> *)in_stack_fffffffffffffb40._M_current);
                bVar2 = ends_with((string *)in_stack_fffffffffffffb20._M_current,
                                  (string *)in_stack_fffffffffffffb18._M_current);
                std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                std::allocator<char>::~allocator(local_1d1);
                if (bVar2) {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb28._M_current,
                             (size_type)in_stack_fffffffffffffb20._M_current,
                             (size_type)in_stack_fffffffffffffb18._M_current);
                  local_10 = default_unit(in_stack_ffffffffffffffe0);
                  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48._M_current,
                             (allocator<char> *)in_stack_fffffffffffffb40._M_current);
                  bVar2 = ends_with((string *)in_stack_fffffffffffffb20._M_current,
                                    (string *)in_stack_fffffffffffffb18._M_current);
                  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                  std::allocator<char>::~allocator(local_219);
                  if (bVar2) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI);
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb28._M_current,
                               (size_type)in_stack_fffffffffffffb20._M_current,
                               (size_type)in_stack_fffffffffffffb18._M_current);
                    local_10 = default_unit(in_stack_ffffffffffffffe0);
                    std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48._M_current,
                               (allocator<char> *)in_stack_fffffffffffffb40._M_current);
                    bVar2 = ends_with((string *)in_stack_fffffffffffffb20._M_current,
                                      (string *)in_stack_fffffffffffffb18._M_current);
                    std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                    std::allocator<char>::~allocator(local_261);
                    if (bVar2) {
                      CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (in_RDI);
                      CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffb28._M_current,
                                 (size_type)in_stack_fffffffffffffb20._M_current,
                                 (size_type)in_stack_fffffffffffffb18._M_current);
                      local_10 = default_unit(in_stack_ffffffffffffffe0);
                      std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48._M_current,
                                 (allocator<char> *)in_stack_fffffffffffffb40._M_current);
                      bVar2 = ends_with((string *)in_stack_fffffffffffffb20._M_current,
                                        (string *)in_stack_fffffffffffffb18._M_current);
                      std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                      std::allocator<char>::~allocator(local_2a9);
                      if (bVar2) {
                        CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (in_RDI);
                        CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffb28._M_current,
                                   (size_type)in_stack_fffffffffffffb20._M_current,
                                   (size_type)in_stack_fffffffffffffb18._M_current);
                        local_10 = default_unit(in_stack_ffffffffffffffe0);
                        std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                      }
                      else {
                        pvVar6 = CLI::std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                 back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffb10);
                        if (*pvVar6 == 's') {
                          sVar5 = CLI::std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::size(in_RDI);
                          if (1 < sVar5) {
                            CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffb10);
                            std::__cxx11::string::string(in_stack_fffffffffffffb50,local_2f0);
                            pVar8 = default_unit(in_stack_ffffffffffffffe0);
                            std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                            return pVar8;
                          }
                        }
                        this = local_311;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48._M_current,
                                   (allocator<char> *)this);
                        bVar3 = ends_with((string *)in_stack_fffffffffffffb20._M_current,
                                          (string *)in_stack_fffffffffffffb18._M_current);
                        std::__cxx11::string::~string(in_stack_fffffffffffffb10);
                        std::allocator<char>::~allocator((allocator<char> *)local_311);
                        if ((bVar3 & 1) == 0) {
                          local_10.base_units_ = (unit_data)0xfa94a488;
                          local_10.commodity_ = 0;
                          local_10.multiplier_ = NAN;
                        }
                        else {
                          CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    (in_RDI);
                          CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffb28._M_current,(size_type)local_348,
                                     (size_type)in_stack_fffffffffffffb18._M_current);
                          local_328 = default_unit(in_stack_ffffffffffffffe0);
                          local_10 = precise_unit::operator/
                                               (this,(precise_unit *)
                                                     CONCAT17(bVar3,in_stack_fffffffffffffb38));
                          std::__cxx11::string::~string(local_10._8_8_);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb28._M_current,
                   (size_type)in_stack_fffffffffffffb20._M_current,
                   (size_type)in_stack_fffffffffffffb18._M_current);
            local_10 = default_unit(in_stack_ffffffffffffffe0);
            std::__cxx11::string::~string(in_stack_fffffffffffffb10);
          }
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb28._M_current,
                 (size_type)in_stack_fffffffffffffb20._M_current,
                 (size_type)in_stack_fffffffffffffb18._M_current);
          local_10 = default_unit(in_stack_ffffffffffffffe0);
          std::__cxx11::string::~string(in_stack_fffffffffffffb10);
        }
      }
    }
  }
  else {
    pvVar7 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                           *)0x6b94d1);
    local_10 = pvVar7->second;
  }
  return local_10;
}

Assistant:

precise_unit default_unit(std::string unit_type)
{
    static const smap measurement_types = loadDefinedMeasurementTypes();

    if (unit_type.size() == 1) {
        switch (unit_type[0]) {
            case 'L':
                return precise::m;
            case 'M':
                return precise::kg;
            case 'T':
                return precise::second;
            case '\xC8':
                return precise::Kelvin;
            case 'I':
                return precise::A;
            case 'N':
                return precise::mol;
            case 'J':
                return precise::cd;
        }
    }
    std::transform(
        unit_type.begin(), unit_type.end(), unit_type.begin(), ::tolower);
    unit_type.erase(
        std::remove(unit_type.begin(), unit_type.end(), ' '), unit_type.end());
    auto fnd = measurement_types.find(unit_type);
    if (fnd != measurement_types.end()) {
        return fnd->second;
    }
    if (unit_type.compare(0, 10, "quantityof") == 0) {
        return default_unit(unit_type.substr(10));
    }
    if (unit_type.compare(0, 6, "rateof") == 0) {
        return default_unit(unit_type.substr(6)) / precise::s;
    }
    auto fof = unit_type.rfind("of");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    fof = unit_type.find_first_of("([{");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    if (unit_type.compare(0, 3, "inv") == 0) {
        auto tunit = default_unit(unit_type.substr(3));
        if (!is_error(tunit)) {
            return tunit.inv();
        }
    }
    if (ends_with(unit_type, "rto")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "fr")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "quantity")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantity")));
    }
    if (ends_with(unit_type, "quantities")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantities")));
    }
    if (ends_with(unit_type, "measure")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("measure")));
    }
    if (ends_with(unit_type, "size")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("size")));
    }
    if (unit_type.back() == 's' && unit_type.size() > 1) {
        unit_type.pop_back();
        return default_unit(unit_type);
    }
    if (ends_with(unit_type, "rate")) {
        return default_unit(
                   unit_type.substr(0, unit_type.size() - strlen("rate"))) /
            precise::s;
    }
    return precise::invalid;
}